

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int client_decode_ech_config_list
              (ptls_context_t *ctx,st_decoded_ech_config_t *decoded,ptls_iovec_t config_list)

{
  ptls_hpke_cipher_suite_t **pppVar1;
  bool bVar2;
  ptls_hpke_cipher_suite_t **pppVar3;
  byte bVar4;
  bool bVar5;
  ptls_hpke_cipher_suite_t *ppVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ushort *puVar10;
  char *name;
  ushort *puVar11;
  ushort *puVar12;
  ulong uVar13;
  ushort *puVar14;
  ptls_hpke_kem_t **pppVar15;
  ulong uVar16;
  ulong uVar17;
  ushort *puVar18;
  ptls_hpke_cipher_suite_t *ppVar19;
  ushort in_R10W;
  ushort uVar20;
  ulong uVar21;
  ushort *puVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  bool bVar26;
  ptls_hpke_cipher_suite_t *local_e0;
  ushort *local_d8;
  size_t local_c8;
  ptls_hpke_cipher_suite_t *local_b8;
  byte local_b0;
  ushort *local_80;
  
  uVar13 = config_list.len;
  puVar14 = (ushort *)config_list.base;
  (decoded->bytes).base = (uint8_t *)0x0;
  (decoded->bytes).len = 0;
  (decoded->public_name).base = (uint8_t *)0x0;
  (decoded->public_name).len = 0;
  decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
  *(undefined8 *)&decoded->max_name_length = 0;
  (decoded->public_key).base = (uint8_t *)0x0;
  (decoded->public_key).len = 0;
  *(undefined8 *)decoded = 0;
  decoded->kem = (ptls_hpke_kem_t *)0x0;
  iVar8 = 0x32;
  iVar23 = 6;
  puVar12 = puVar14;
  if (1 < uVar13) {
    lVar9 = 0;
    uVar21 = 0;
    do {
      uVar21 = (ulong)*(byte *)((long)puVar14 + lVar9) | uVar21 << 8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 2);
    puVar12 = puVar14 + 1;
    if (uVar21 <= uVar13 - 2) {
      puVar22 = (ushort *)(uVar21 + (long)puVar12);
      bVar5 = false;
      do {
        iVar8 = 0x32;
        local_80 = puVar12;
        if (1 < (long)puVar22 - (long)puVar12) {
          in_R10W = *puVar12 << 8 | *puVar12 >> 8;
          local_80 = puVar12 + 1;
          iVar8 = 0;
        }
        iVar23 = 6;
        puVar10 = local_80;
        uVar20 = in_R10W;
        if ((1 < (long)puVar22 - (long)puVar12) &&
           (iVar8 = 0x32, 1 < (ulong)((long)puVar22 - (long)local_80))) {
          lVar9 = 0;
          uVar21 = 0;
          do {
            uVar21 = (ulong)*(byte *)((long)local_80 + lVar9) | uVar21 << 8;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 2);
          puVar10 = local_80 + 1;
          if (uVar21 <= (ulong)((long)puVar22 - (long)puVar10)) {
            puVar18 = (ushort *)((long)local_80 + uVar21 + 2);
            puVar11 = puVar18;
            iVar24 = 0;
            if (in_R10W == 0xfe0d) {
              pppVar1 = (ctx->ech).client.ciphers;
              pppVar15 = (ctx->ech).client.kems;
              if (uVar21 == 0) {
                bVar4 = 0;
LAB_00119610:
                iVar23 = 0x32;
                local_b8 = (ptls_hpke_cipher_suite_t *)0x0;
                local_80 = (ushort *)0x0;
                uVar21 = 0;
LAB_0011962d:
                local_e0 = (ptls_hpke_cipher_suite_t *)0x0;
LAB_0011963f:
                local_b0 = 0;
                local_d8 = (ushort *)0x0;
                local_c8 = 0;
                name = (char *)0x0;
                iVar25 = iVar23;
LAB_0011964a:
                iVar24 = iVar25;
                free(name);
                iVar8 = iVar23;
              }
              else {
                bVar4 = (byte)local_80[1];
                puVar10 = (ushort *)((long)local_80 + 3);
                if ((long)puVar18 - (long)puVar10 < 2) goto LAB_00119610;
                uVar20 = *puVar10;
                puVar10 = (ushort *)((long)local_80 + 5);
                local_b8 = (ptls_hpke_cipher_suite_t *)*pppVar15;
                while (local_b8 != (ptls_hpke_cipher_suite_t *)0x0) {
                  pppVar15 = pppVar15 + 1;
                  if ((local_b8->id).kdf == (uint16_t)(uVar20 << 8 | uVar20 >> 8))
                  goto LAB_001195ee;
                  local_b8 = (ptls_hpke_cipher_suite_t *)*pppVar15;
                }
                local_b8 = (ptls_hpke_cipher_suite_t *)0x0;
LAB_001195ee:
                iVar23 = 0x32;
                if ((ulong)((long)puVar18 - (long)puVar10) < 2) {
LAB_001197be:
                  local_80 = (ushort *)0x0;
                  uVar21 = 0;
                  bVar26 = false;
                }
                else {
                  lVar9 = 0;
                  uVar21 = 0;
                  do {
                    uVar21 = (ulong)*(byte *)((long)puVar10 + lVar9) | uVar21 << 8;
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 2);
                  local_80 = (ushort *)((long)local_80 + 7);
                  puVar10 = local_80;
                  if ((ulong)((long)puVar18 - (long)local_80) <= uVar21 - 1) goto LAB_001197be;
                  puVar10 = (ushort *)(uVar21 + (long)local_80);
                  bVar26 = true;
                  iVar23 = 0;
                }
                if (!bVar26) goto LAB_0011962d;
                iVar24 = 0x32;
                bVar26 = true;
                if ((ulong)((long)puVar18 - (long)puVar10) < 2) {
LAB_00119810:
                  local_e0 = (ptls_hpke_cipher_suite_t *)0x0;
                }
                else {
                  lVar9 = 0;
                  uVar16 = 0;
                  do {
                    uVar17 = uVar16 << 8;
                    uVar16 = *(byte *)((long)puVar10 + lVar9) | uVar17;
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 2);
                  puVar10 = puVar10 + 1;
                  if ((ulong)((long)puVar18 - (long)puVar10) < uVar16) goto LAB_00119810;
                  puVar11 = (ushort *)(uVar16 + (long)puVar10);
                  local_e0 = (ptls_hpke_cipher_suite_t *)0x0;
                  do {
                    lVar9 = (long)puVar11 - (long)puVar10;
                    iVar24 = 0x32;
                    if (1 < lVar9) {
                      uVar17 = (ulong)(ushort)(*puVar10 << 8 | *puVar10 >> 8);
                      puVar10 = puVar10 + 1;
                      iVar24 = 0;
                    }
                    bVar26 = true;
                    if ((lVar9 < 2) || (iVar24 = 0x32, (long)puVar11 - (long)puVar10 < 2)) {
                      bVar2 = false;
                    }
                    else {
                      uVar20 = *puVar10;
                      puVar10 = puVar10 + 1;
                      bVar2 = true;
                      if ((local_e0 == (ptls_hpke_cipher_suite_t *)0x0) &&
                         (ppVar19 = *pppVar1, pppVar3 = pppVar1,
                         ppVar19 != (ptls_hpke_cipher_suite_t *)0x0)) {
                        do {
                          if (((ppVar19->id).kdf == (uint16_t)uVar17) &&
                             (ppVar6 = ppVar19,
                             (ppVar19->id).aead == (uint16_t)(uVar20 << 8 | uVar20 >> 8))) break;
                          ppVar19 = pppVar3[1];
                          ppVar6 = local_e0;
                          pppVar3 = pppVar3 + 1;
                        } while (ppVar19 != (ptls_hpke_cipher_suite_t *)0x0);
                        local_e0 = ppVar6;
                        bVar26 = false;
                        iVar24 = 0;
                      }
                      else {
                        bVar26 = false;
                        iVar24 = 0;
                      }
                    }
                    if (!bVar2) goto LAB_001198f8;
                  } while (puVar10 != puVar11);
                  bVar26 = false;
                }
LAB_001198f8:
                iVar23 = iVar24;
                if (bVar26) goto LAB_0011963f;
                if (!bVar26) {
                  if (puVar10 == puVar18) {
                    iVar23 = 0x32;
                    goto LAB_0011963f;
                  }
                  puVar11 = (ushort *)((long)puVar10 + 1);
                  local_b0 = (byte)*puVar10;
                  iVar25 = 0x32;
                  iVar23 = 0x32;
                  if (puVar11 == puVar18) {
LAB_001199e4:
                    local_d8 = (ushort *)0x0;
                    local_c8 = 0;
                    name = (char *)0x0;
                    bVar26 = false;
                  }
                  else {
                    local_c8 = (size_t)*(byte *)puVar11;
                    local_d8 = puVar10 + 1;
                    puVar11 = local_d8;
                    if (((ulong)((long)puVar18 - (long)local_d8) < local_c8) || (local_c8 == 0))
                    goto LAB_001199e4;
                    name = (char *)malloc(local_c8 + 1);
                    if (name == (char *)0x0) {
                      name = (char *)0x0;
                    }
                    else {
                      memcpy(name,local_d8,local_c8);
                      name[local_c8] = '\0';
                    }
                    iVar23 = 0;
                    if (name == (char *)0x0) {
                      iVar25 = 0x201;
                      iVar23 = 0x201;
                      goto LAB_001199e4;
                    }
                    puVar11 = (ushort *)(local_c8 + (long)local_d8);
                    iVar8 = ptls_server_name_is_ipaddr(name);
                    bVar26 = true;
                    iVar25 = iVar23;
                    if (iVar8 != 0) {
                      local_b8 = (ptls_hpke_cipher_suite_t *)0x0;
                      local_e0 = (ptls_hpke_cipher_suite_t *)0x0;
                      local_d8 = (ushort *)0x0;
                      local_c8 = 0;
                    }
                  }
                  puVar10 = puVar11;
                  if (bVar26) {
                    bVar26 = true;
                    iVar8 = iVar23;
                    iVar24 = iVar25;
                    iVar23 = 0x32;
                    if (1 < (ulong)((long)puVar18 - (long)puVar11)) {
                      lVar9 = 0;
                      uVar16 = 0;
                      do {
                        uVar16 = (ulong)*(byte *)((long)puVar11 + lVar9) | uVar16 << 8;
                        lVar9 = lVar9 + 1;
                      } while (lVar9 != 2);
                      puVar10 = puVar11 + 1;
                      if (uVar16 <= (ulong)((long)puVar18 - (long)puVar10)) {
                        puVar11 = (ushort *)((long)puVar11 + uVar16 + 2);
                        if (0 < (long)uVar16) {
                          do {
                            lVar9 = (long)puVar11 - (long)puVar10;
                            iVar25 = 0x32;
                            if (1 < lVar9) {
                              uVar16 = (ulong)(ushort)(*puVar10 << 8 | *puVar10 >> 8);
                              puVar10 = puVar10 + 1;
                              iVar25 = 0;
                            }
                            bVar26 = true;
                            if (1 < lVar9) {
                              iVar25 = 0x32;
                              bVar26 = true;
                              if ((ulong)((long)puVar11 - (long)puVar10) < 2) {
                                bVar2 = false;
                              }
                              else {
                                lVar9 = 0;
                                uVar17 = 0;
                                do {
                                  uVar17 = (ulong)*(byte *)((long)puVar10 + lVar9) | uVar17 << 8;
                                  lVar9 = lVar9 + 1;
                                } while (lVar9 != 2);
                                puVar10 = puVar10 + 1;
                                bVar2 = uVar17 <= (ulong)((long)puVar11 - (long)puVar10);
                                if (bVar2) {
                                  puVar10 = (ushort *)((long)puVar10 + uVar17);
                                  iVar25 = 0;
                                }
                                bVar26 = !bVar2;
                              }
                              if (bVar2) {
                                bVar26 = false;
                                if ((short)uVar16 < 0) {
                                  local_e0 = (ptls_hpke_cipher_suite_t *)0x0;
                                  local_b8 = (ptls_hpke_cipher_suite_t *)0x0;
                                }
                              }
                            }
                            iVar8 = iVar25;
                            iVar24 = iVar25;
                            iVar23 = iVar25;
                            if (bVar26) goto LAB_00119b37;
                          } while (puVar10 < puVar11);
                        }
                        bVar26 = puVar10 != puVar11;
                        iVar7 = 0x32;
                        iVar8 = iVar25;
                        iVar24 = iVar25;
                        iVar23 = iVar25;
                        if (bVar26) {
                          iVar8 = iVar7;
                          iVar24 = iVar7;
                          iVar23 = iVar7;
                        }
                      }
                    }
LAB_00119b37:
                    iVar25 = iVar23;
                    if (!bVar26) {
                      if (bVar26) goto LAB_0011966c;
                      if (puVar10 != puVar18) {
                        iVar23 = 0x32;
                        iVar25 = iVar23;
                      }
                    }
                  }
                  goto LAB_0011964a;
                }
                local_d8 = (ushort *)0x0;
                local_b0 = 0;
                local_c8 = 0;
                iVar8 = iVar24;
              }
LAB_0011966c:
              iVar23 = 6;
              if (iVar8 == 0) {
                iVar23 = 0;
                if (((!bVar5) && (local_b8 != (ptls_hpke_cipher_suite_t *)0x0)) &&
                   (local_e0 != (ptls_hpke_cipher_suite_t *)0x0)) {
                  decoded->id = bVar4;
                  *(undefined4 *)&decoded->field_0x4 = 0;
                  *(undefined4 *)&decoded->field_0x1 = 0;
                  decoded->kem = (ptls_hpke_kem_t *)local_b8;
                  (decoded->public_key).base = (uint8_t *)local_80;
                  (decoded->public_key).len = uVar21;
                  decoded->cipher = local_e0;
                  decoded->max_name_length = local_b0;
                  *(undefined4 *)&decoded->field_0x2c = 0;
                  *(undefined4 *)&decoded->field_0x29 = 0;
                  (decoded->public_name).base = (uint8_t *)local_d8;
                  (decoded->public_name).len = local_c8;
                  *(undefined4 *)&(decoded->bytes).base = 0;
                  *(undefined4 *)((long)&(decoded->bytes).base + 4) = 0;
                  *(undefined4 *)&(decoded->bytes).len = 0;
                  *(undefined4 *)((long)&(decoded->bytes).len + 4) = 0;
                  (decoded->bytes).base = (uint8_t *)puVar12;
                  (decoded->bytes).len = (long)puVar18 - (long)puVar12;
                  bVar5 = true;
                  iVar23 = 0;
                }
              }
              puVar11 = puVar10;
              uVar20 = 0xfe0d;
              if (iVar8 != 0) goto LAB_00119765;
            }
            iVar8 = iVar24;
            puVar10 = puVar11;
            iVar23 = 0;
            uVar20 = in_R10W;
            if (puVar10 != puVar18) {
              iVar8 = 0x32;
              iVar23 = 6;
            }
          }
        }
LAB_00119765:
        puVar12 = puVar10;
        if (iVar23 != 0) goto LAB_00119c0f;
        in_R10W = uVar20;
      } while (puVar10 != puVar22);
      iVar23 = 0;
    }
  }
LAB_00119c0f:
  if (iVar23 != 6) {
    if (iVar23 != 0) {
      return iVar8;
    }
    iVar8 = 0x32;
    if (puVar12 == (ushort *)((long)puVar14 + uVar13)) {
      iVar8 = 0;
    }
  }
  if (iVar8 != 0) {
    (decoded->bytes).base = (uint8_t *)0x0;
    (decoded->bytes).len = 0;
    (decoded->public_name).base = (uint8_t *)0x0;
    (decoded->public_name).len = 0;
    decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
    *(undefined8 *)&decoded->max_name_length = 0;
    (decoded->public_key).base = (uint8_t *)0x0;
    (decoded->public_key).len = 0;
    *(undefined8 *)decoded = 0;
    decoded->kem = (ptls_hpke_kem_t *)0x0;
  }
  return iVar8;
}

Assistant:

static int client_decode_ech_config_list(ptls_context_t *ctx, struct st_decoded_ech_config_t *decoded, ptls_iovec_t config_list)
{
    const uint8_t *src = config_list.base, *const end = src + config_list.len;
    int match_found = 0, ret;

    *decoded = (struct st_decoded_ech_config_t){0};

    ptls_decode_block(src, end, 2, {
        do {
            const uint8_t *config_start = src;
            uint16_t version;
            if ((ret = ptls_decode16(&version, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, {
                /* If the block is the one that we recognize, parse it, then adopt if if possible. Otherwise, skip. */
                if (version == PTLS_ECH_CONFIG_VERSION) {
                    struct st_decoded_ech_config_t thisconf;
                    if ((ret = decode_one_ech_config(ctx->ech.client.kems, ctx->ech.client.ciphers, &thisconf, &src, end)) != 0)
                        goto Exit;
                    if (!match_found && thisconf.kem != NULL && thisconf.cipher != NULL) {
                        *decoded = thisconf;
                        decoded->bytes = ptls_iovec_init(config_start, end - config_start);
                        match_found = 1;
                    }
                } else {
                    src = end;
                }
            });
        } while (src != end);
    });
    ret = 0;

Exit:
    if (ret != 0)
        *decoded = (struct st_decoded_ech_config_t){0};
    return ret;
}